

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_map.c
# Opt level: O3

apx_file_t * apx_fileMap_find_by_address(apx_fileMap_t *self,uint32_t address)

{
  apx_file_t *self_00;
  _Bool _Var1;
  adt_list_elem_t *pElem;
  
  if (self != (apx_fileMap_t *)0x0) {
    if (((self->last_file != (apx_file_t *)0x0) &&
        (_Var1 = apx_file_address_in_range(self->last_file,address), _Var1)) &&
       (self->last_file != (apx_file_t *)0x0)) {
      return self->last_file;
    }
    for (pElem = adt_list_iter_first(&self->file_list); pElem != (adt_list_elem_t *)0x0;
        pElem = adt_list_iter_next(pElem)) {
      self_00 = (apx_file_t *)pElem->pItem;
      if (self_00 == (apx_file_t *)0x0) {
        __assert_fail("file != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/file_map.c"
                      ,0xa0,"apx_file_t *apx_fileMap_find_by_address(apx_fileMap_t *, uint32_t)");
      }
      _Var1 = apx_file_address_in_range(self_00,address);
      if (_Var1) {
        self->last_file = self_00;
        return self_00;
      }
    }
  }
  return (apx_file_t *)0x0;
}

Assistant:

apx_file_t* apx_fileMap_find_by_address(apx_fileMap_t* self, uint32_t address)
{
   apx_file_t *retval = NULL;
   if (self != NULL)
   {
      if (self->last_file != NULL)
      {
         if (apx_file_address_in_range(self->last_file, address))
         {
            retval = self->last_file;
         }
      }
      if (retval == NULL)
      {
         adt_list_elem_t *pIter = adt_list_iter_first(&self->file_list);
         while(pIter != NULL)
         {
            apx_file_t *file = (apx_file_t*) pIter->pItem;
            assert(file != NULL);
            if (apx_file_address_in_range(file, address))
            {
               self->last_file = retval = file;
               break;
            }
            pIter = adt_list_iter_next(pIter);
         }
      }
   }
   return retval;
}